

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# winmakefile.cpp
# Opt level: O2

void __thiscall Win32MakefileGenerator::writeLibsPart(Win32MakefileGenerator *this,QTextStream *t)

{
  QMakeProject *pQVar1;
  bool bVar2;
  QTextStream *pQVar3;
  long in_FS_OFFSET;
  ProKey PStack_1b8;
  QArrayDataPointer<ProString> local_188;
  QArrayDataPointer<char16_t> local_170;
  ProKey local_158;
  QArrayDataPointer<ProString> local_128;
  QArrayDataPointer<char16_t> local_110;
  QArrayDataPointer<ProString> local_f8;
  QArrayDataPointer<char16_t> local_e0;
  QArrayDataPointer<ProString> local_c8;
  QArrayDataPointer<char16_t> local_b0;
  ProKey local_98;
  ProString local_68;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->super_MakefileGenerator).project;
  QString::QString((QString *)&local_158,"staticlib");
  bVar2 = QMakeProject::isActiveConfig(pQVar1,(QString *)&local_158,false);
  if (bVar2) {
    pQVar1 = (this->super_MakefileGenerator).project;
    ProKey::ProKey(&local_98,"TEMPLATE");
    QMakeEvaluator::first(&local_68,&pQVar1->super_QMakeEvaluator,&local_98);
    bVar2 = ProString::operator==(&local_68,"lib");
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_98);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_158);
    if (bVar2) {
      pQVar3 = (QTextStream *)QTextStream::operator<<(t,"LIBAPP        = ");
      ProKey::ProKey((ProKey *)&local_68,"QMAKE_LIB");
      (*(this->super_MakefileGenerator).super_QMakeSourceFileInfo._vptr_QMakeSourceFileInfo[0x16])
                ((QArrayDataPointer<char16_t> *)&local_98,this,&local_68);
      pQVar3 = (QTextStream *)QTextStream::operator<<(pQVar3,(QString *)&local_98);
      Qt::endl(pQVar3);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_98);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
      pQVar3 = (QTextStream *)QTextStream::operator<<(t,"LIBFLAGS      = ");
      ProKey::ProKey((ProKey *)&local_68,"QMAKE_LIBFLAGS");
      (*(this->super_MakefileGenerator).super_QMakeSourceFileInfo._vptr_QMakeSourceFileInfo[0x16])
                ((QArrayDataPointer<char16_t> *)&local_98,this,&local_68);
      pQVar3 = (QTextStream *)QTextStream::operator<<(pQVar3,(QString *)&local_98);
      Qt::endl(pQVar3);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_98);
      goto LAB_001de2c0;
    }
  }
  else {
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_158);
  }
  pQVar3 = (QTextStream *)QTextStream::operator<<(t,"LINKER        = ");
  ProKey::ProKey((ProKey *)&local_68,"QMAKE_LINK");
  (*(this->super_MakefileGenerator).super_QMakeSourceFileInfo._vptr_QMakeSourceFileInfo[0x16])
            ((QArrayDataPointer<char16_t> *)&local_98,this,&local_68);
  pQVar3 = (QTextStream *)QTextStream::operator<<(pQVar3,(QString *)&local_98);
  Qt::endl(pQVar3);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_98);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
  pQVar3 = (QTextStream *)QTextStream::operator<<(t,"LFLAGS        = ");
  ProKey::ProKey((ProKey *)&local_68,"QMAKE_LFLAGS");
  (*(this->super_MakefileGenerator).super_QMakeSourceFileInfo._vptr_QMakeSourceFileInfo[0x16])
            ((QArrayDataPointer<char16_t> *)&local_98,this,&local_68);
  pQVar3 = (QTextStream *)QTextStream::operator<<(pQVar3,(QString *)&local_98);
  Qt::endl(pQVar3);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_98);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
  pQVar3 = (QTextStream *)QTextStream::operator<<(t,"LIBS          = ");
  ProKey::ProKey((ProKey *)&local_68,"LIBS");
  MakefileGenerator::fixLibFlags
            ((ProStringList *)&local_c8,&this->super_MakefileGenerator,(ProKey *)&local_68);
  ProStringList::join((QString *)&local_b0,(ProStringList *)&local_c8,(QChar)0x20);
  pQVar3 = (QTextStream *)QTextStream::operator<<(pQVar3,(QString *)&local_b0);
  pQVar3 = (QTextStream *)QTextStream::operator<<(pQVar3,' ');
  ProKey::ProKey(&local_98,"LIBS_PRIVATE");
  MakefileGenerator::fixLibFlags
            ((ProStringList *)&local_f8,&this->super_MakefileGenerator,&local_98);
  ProStringList::join((QString *)&local_e0,(ProStringList *)&local_f8,(QChar)0x20);
  pQVar3 = (QTextStream *)QTextStream::operator<<(pQVar3,(QString *)&local_e0);
  pQVar3 = (QTextStream *)QTextStream::operator<<(pQVar3,' ');
  ProKey::ProKey(&local_158,"QMAKE_LIBS");
  MakefileGenerator::fixLibFlags
            ((ProStringList *)&local_128,&this->super_MakefileGenerator,&local_158);
  ProStringList::join((QString *)&local_110,(ProStringList *)&local_128,(QChar)0x20);
  pQVar3 = (QTextStream *)QTextStream::operator<<(pQVar3,(QString *)&local_110);
  pQVar3 = (QTextStream *)QTextStream::operator<<(pQVar3,' ');
  ProKey::ProKey(&PStack_1b8,"QMAKE_LIBS_PRIVATE");
  MakefileGenerator::fixLibFlags
            ((ProStringList *)&local_188,&this->super_MakefileGenerator,&PStack_1b8);
  ProStringList::join((QString *)&local_170,(ProStringList *)&local_188,(QChar)0x20);
  pQVar3 = (QTextStream *)QTextStream::operator<<(pQVar3,(QString *)&local_170);
  Qt::endl(pQVar3);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_170);
  QArrayDataPointer<ProString>::~QArrayDataPointer(&local_188);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&PStack_1b8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_110);
  QArrayDataPointer<ProString>::~QArrayDataPointer(&local_128);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_158);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_e0);
  QArrayDataPointer<ProString>::~QArrayDataPointer(&local_f8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_98);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b0);
  QArrayDataPointer<ProString>::~QArrayDataPointer(&local_c8);
LAB_001de2c0:
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Win32MakefileGenerator::writeLibsPart(QTextStream &t)
{
    if(project->isActiveConfig("staticlib") && project->first("TEMPLATE") == "lib") {
        t << "LIBAPP        = " << var("QMAKE_LIB") << Qt::endl;
        t << "LIBFLAGS      = " << var("QMAKE_LIBFLAGS") << Qt::endl;
    } else {
        t << "LINKER        = " << var("QMAKE_LINK") << Qt::endl;
        t << "LFLAGS        = " << var("QMAKE_LFLAGS") << Qt::endl;
        t << "LIBS          = " << fixLibFlags("LIBS").join(' ') << ' '
                                << fixLibFlags("LIBS_PRIVATE").join(' ') << ' '
                                << fixLibFlags("QMAKE_LIBS").join(' ') << ' '
                                << fixLibFlags("QMAKE_LIBS_PRIVATE").join(' ') << Qt::endl;
    }
}